

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::TeamCityReporter::printSectionHeader(TeamCityReporter *this,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  pointer pcVar3;
  size_t sVar4;
  char cVar5;
  long lVar6;
  pointer pSVar7;
  SourceLineInfo lineInfo;
  char local_71;
  TeamCityReporter *local_70;
  Column local_68;
  
  pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar7 = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar2 != pSVar7) {
    cVar5 = (char)os;
    if (1 < (ulong)(((long)pSVar7 - (long)pSVar2 >> 4) * -0x5555555555555555)) {
      lVar6 = 0x4f;
      do {
        std::ostream::put(cVar5);
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      local_68.m_string._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_68,1);
      pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pSVar7 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
      local_70 = this;
      if (pSVar7 != pSVar2) {
        paVar1 = &local_68.m_string.field_2;
        do {
          lVar6 = std::__cxx11::string::find((char *)pSVar7,0x2a3237,0);
          sVar4 = lVar6 + 2;
          if (lVar6 == -1) {
            sVar4 = 0;
          }
          pcVar3 = (pSVar7->name)._M_dataplus._M_p;
          local_68.m_string._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar3,pcVar3 + (pSVar7->name)._M_string_length);
          local_68.m_width = 0x4f;
          local_68.m_initialIndent = 0;
          local_68.m_indent = sVar4;
          TextFlow::operator<<(os,&local_68);
          local_71 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(os,&local_71,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.m_string._M_dataplus._M_p != paVar1) {
            operator_delete(local_68.m_string._M_dataplus._M_p,
                            local_68.m_string.field_2._M_allocated_capacity + 1);
          }
          pSVar7 = pSVar7 + 1;
        } while (pSVar7 != pSVar2);
      }
      lVar6 = 0x4f;
      do {
        std::ostream::put(cVar5);
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      local_68.m_string._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_68,1);
      this = local_70;
    }
    pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_68.m_string._M_dataplus._M_p = (pSVar2->lineInfo).file;
    local_68.m_string._M_string_length = (pSVar2->lineInfo).line;
    operator<<(os,(SourceLineInfo *)&local_68);
    local_71 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_71,1);
    lVar6 = 0x4f;
    do {
      std::ostream::put(cVar5);
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
    return;
  }
  __assert_fail("!m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                ,0x28d6,"void Catch::TeamCityReporter::printSectionHeader(std::ostream &)");
}

Assistant:

IEventListenerPtr createReporter(std::string const& reporterName, ReporterConfig&& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, CATCH_MOVE(config));
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << '\'');

            return reporter;
        }